

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_job_help.hh
# Opt level: O2

void add_help(QPDFArgParser *ap)

{
  allocator<char> local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"usage",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"basic invocation",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Read a PDF file, apply transformations or modifications, and write\na new PDF file.\n\nUsage: qpdf [infile] [options] [outfile]\n   OR  qpdf --help[={topic|--option}]\n\n- infile, options, and outfile may be in any order as long as infile\n  precedes outfile.\n- Use --empty in place of an input file for a zero-page, empty input\n- Use --replace-input in place of an output file to overwrite the\n  input file with the output\n- outfile may be - to write to stdout; reading from stdin is not supported\n- @filename is an argument file; each line is treated as a separate\n  command-line argument\n- @- may be used to read arguments from stdin\n- Later options may override earlier options if contradictory\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--empty",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"usage",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"use empty file as input",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Use in place of infile for an empty input. Especially useful\nwith --pages.\n",
             &local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--replace-input",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"usage",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"overwrite input with output",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Use in place of outfile to overwrite the input file with the output.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--job-json-file",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"usage",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"job JSON file",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--job-json-file=file\n\nSpecify the name of a file whose contents are expected to\ncontain a QPDFJob JSON file. Run qpdf --job-json-help for a\ndescription of the JSON input file format.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"exit-status",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"meanings of qpdf\'s exit codes",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Meaning of exit codes:\n\n- 0: no errors or warnings\n- 1: not used by qpdf but may be used by the shell if unable to invoke qpdf\n- 2: errors detected\n- 3: warnings detected, unless --warning-exit-0 is given\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--warning-exit-0",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"exit-status",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"exit 0 even with warnings",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Use exit status 0 instead of 3 when warnings are present. When\ncombined with --no-warn, warnings are completely ignored.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"completion",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"shell completion",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Shell completion is supported with bash and zsh. Use\neval $(qpdf --completion-bash) or eval $(qpdf --completion-zsh)\nto enable. The QPDF_EXECUTABLE environment variable overrides the\npath to qpdf that these commands output.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--completion-bash",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"completion",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"enable bash completion",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Output a command that enables bash completion\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--completion-zsh",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"completion",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"enable zsh completion",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Output a command that enables zsh completion\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"help",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"information about qpdf",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Help options provide some information about qpdf itself. Help\noptions are only valid as the first and only command-line argument.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--help",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"help",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"provide help",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--help[=--option|topic]\n\n--help: provide general information and a list of topics\n--help=--option: provide help on a specific option\n--help=topic: provide help on a topic\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--version",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"help",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show qpdf version",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Display the version of qpdf.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--copyright",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"help",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show copyright information",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Display copyright and license information.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--show-crypto",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"help",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show available crypto providers",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Show a list of available crypto providers, one per line. The\ndefault provider is shown first.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--job-json-help",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"help",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show format of job JSON",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Describe the format of the QPDFJob JSON input used by\n--job-json-file.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--zopfli",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"help",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"indicate whether zopfli is enabled and active",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "If zopfli support is compiled in, indicate whether it is active,\nand exit normally. Otherwise, indicate that it is not compiled\nin, and exit with an error code. If zopfli is compiled in,\nactivate it by setting the ``QPDF_ZOPFLI`` environment variable.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"general",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"general options",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "General options control qpdf\'s behavior in ways that are not\ndirectly related to the operation it is performing.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--password",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"general",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"password for encrypted file",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--password=password\n\nSpecify a password for an encrypted, password-protected file.\nNot needed for encrypted files without a password.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--password-file",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"general",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"read password from a file",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--password-file=filename\n\nThe first line of the specified file is used as the password.\nThis is used in place of the --password option.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--verbose",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"general",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"print additional information",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Output additional information about various things qpdf is\ndoing, including information about files created and operations\nperformed.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--progress",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"general",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show progress when writing",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Indicate progress when writing files.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--no-warn",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"general",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"suppress printing of warning messages",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Suppress printing of warning messages. If warnings were\nencountered, qpdf still exits with exit status 3.\nUse --warning-exit-0 with --no-warn to completely ignore\nwarnings.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--deterministic-id",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"general",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"generate ID deterministically",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Generate a secure, random document ID only using static\ninformation, such as the page contents. Does not use the file\'s\nname or attributes or the current time.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--allow-weak-crypto",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"general",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"allow insecure cryptographic algorithms",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Allow creation of files with weak cryptographic algorithms. This\noption is necessary to create 40-bit files or 128-bit files that\nuse RC4 encryption.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--keep-files-open",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"general",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"manage keeping multiple files open",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--keep-files-open=[y|n]\n\nWhen qpdf needs to work with many files, as when merging large\nnumbers of files, explicitly indicate whether files should be\nkept open. The default behavior is to determine this based on\nthe number of files.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--keep-files-open-threshold",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"general",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"set threshold for --keep-files-open",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--keep-files-open-threshold=count\n\nSet the threshold used by --keep-files-open, overriding the\ndefault value of 200.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"advanced-control",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"tweak qpdf\'s behavior",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Advanced control options control qpdf\'s behavior in ways that would\nnormally never be needed by a user but that may be useful to\ndevelopers or people investigating problems with specific files.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--password-is-hex-key",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"advanced-control",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"provide hex-encoded encryption key",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Provide the underlying file encryption key as a hex-encoded\nstring rather than supplying a password. This is an expert\noption.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--suppress-password-recovery",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"advanced-control",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"don\'t try different password encodings",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Suppress qpdf\'s usual behavior of attempting different encodings\nof a password that contains non-ASCII Unicode characters if the\nfirst attempt doesn\'t succeed.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--password-mode",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"advanced-control",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"tweak how qpdf encodes passwords",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--password-mode=mode\n\nFine-tune how qpdf controls encoding of Unicode passwords. Valid\noptions are auto, bytes, hex-bytes, and unicode.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--suppress-recovery",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"advanced-control",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"suppress error recovery",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Avoid attempting to recover when errors are found in a file\'s\ncross reference table or stream lengths.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--ignore-xref-streams",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"advanced-control",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"use xref tables rather than streams",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Ignore any cross-reference streams in the file, falling back to\ncross-reference tables or triggering document recovery.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"transformation",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"make structural PDF changes",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "The options below tell qpdf to apply transformations that change\nthe structure without changing the content.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--linearize",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"linearize (web-optimize) output",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Create linearized (web-optimized) output files.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--encrypt",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"start encryption options",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--encrypt [options] --\n\nRun qpdf --help=encryption for details.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--decrypt",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"remove encryption from input file",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Create an unencrypted output file even if the input file was\nencrypted. Normally qpdf preserves whatever encryption was\npresent on the input file. This option overrides that behavior.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--remove-restrictions",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"remove security restrictions from input file",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Remove restrictions associated with digitally signed PDF files.\nThis may be combined with --decrypt to allow free editing of\npreviously signed/encrypted files. This option invalidates and\ndisables any digital signatures but leaves their visual\nappearances intact.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--copy-encryption",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"copy another file\'s encryption details",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--copy-encryption=file\n\nCopy encryption details from the specified file instead of\npreserving the input file\'s encryption. Use --encryption-file-password\nto specify the encryption file\'s password.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--encryption-file-password",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"supply password for --copy-encryption",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--encryption-file-password=password\n\nIf the file named in --copy-encryption requires a password, use\nthis option to supply the password.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--qdf",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"enable viewing PDF code in a text editor",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Create a PDF file suitable for viewing in a text editor and even\nediting. This is for editing the PDF code, not the page contents.\nAll streams that can be uncompressed are uncompressed, and\ncontent streams are normalized, among other changes. The\ncompanion tool \"fix-qdf\" can be used to repair hand-edited QDF\nfiles. QDF is a feature specific to the qpdf tool. Please see\nthe \"QDF Mode\" chapter in the manual.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--no-original-object-ids",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"omit original object IDs in qdf",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Omit comments in a QDF file indicating the object ID an object\nhad in the original file.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--compress-streams",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"compress uncompressed streams",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--compress-streams=[y|n]\n\nSetting --compress-streams=n prevents qpdf from compressing\nuncompressed streams. This can be useful if you are leaving some\nstreams uncompressed intentionally.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--decode-level",&local_8b)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"control which streams to uncompress",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--decode-level=parameter\n\nWhen uncompressing streams, control which types of compression\nschemes should be uncompressed:\n- none: don\'t uncompress anything. This is the default with\n  --json-output.\n- generalized: uncompress streams compressed with a\n  general-purpose compression algorithm. This is the default\n  except when --json-output is given.\n- specialized: in addition to generalized, also uncompress\n  streams compressed with a special-purpose but non-lossy\n  compression scheme\n- all: in addition to specialized, uncompress streams compressed\n  with lossy compression schemes like JPEG (DCT)\nqpdf does not know how to uncompress all compression schemes.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--stream-data",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"control stream compression",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--stream-data=parameter\n\nThis option controls how streams are compressed in the output.\nIt is less granular than the newer options, --compress-streams\nand --decode-level.\n\nParameters:\n- compress: same as --compress-streams=y --decode-level=generalized\n- preserve: same as --compress-streams=n --decode-level=none\n- uncompress: same as --compress-streams=n --decode-level=generalized\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--recompress-flate",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"uncompress and recompress flate",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "The default generalized compression scheme used by PDF is flate,\nwhich is the same as used by zip and gzip. Usually qpdf just\nleaves these alone. This option tells qpdf to uncompress and\nrecompress streams compressed with flate. This can be useful\nwhen combined with --compression-level.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--compression-level",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"set compression level for flate",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--compression-level=level\n\nSet a compression level from 1 (least, fastest) to 9 (most,\nslowest) when compressing files with flate (used in zip and\ngzip), which is the default compression for most PDF files.\nYou need --recompress-flate with this option if you want to\nchange already compressed streams.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--jpeg-quality",&local_8b)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"set jpeg quality level for jpeg",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--jpeg-quality=level\n\nWhen rewriting images with --optimize-images, set a quality\nlevel from 0 (lowest) to 100 (highest) for writing new images.\nHigher quality results in larger images, and lower quality\nresults in smaller images. This option is only effective when\ncombined with --optimize-images.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--normalize-content",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"fix newlines in content streams",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--normalize-content=[y|n]\n\nNormalize newlines to UNIX-style newlines in PDF content\nstreams, which is useful for viewing them in a programmer\'s text\neditor across multiple platforms. This is also turned on by\n--qdf.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--object-streams",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"control use of object streams",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--object-streams=mode\n\nControl what qpdf does regarding object streams. Options:\n- preserve: preserve original object streams, if any (the default)\n- disable: create output files with no object streams\n- generate: create object streams, and compress objects when possible\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--preserve-unreferenced",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"preserve unreferenced objects",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Preserve all objects from the input even if not referenced.\n",
             &local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--remove-unreferenced-resources",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"remove unreferenced page resources",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--remove-unreferenced-resources=parameter\n\nRemove from a page\'s resource dictionary any resources that are\nnot referenced in the page\'s contents. Parameters: \"auto\"\n(default), \"yes\", \"no\".\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--preserve-unreferenced-resources",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"use --remove-unreferenced-resources=no",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Synonym for --remove-unreferenced-resources=no. Use that instead.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--newline-before-endstream",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"force a newline before endstream",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "For an extra newline before endstream. Using this option enables\nqpdf to preserve PDF/A when rewriting such files.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--coalesce-contents",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"combine content streams",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "If a page has an array of content streams, concatenate them into\na single content stream.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--externalize-inline-images",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"convert inline to regular images",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Convert inline images to regular images.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--ii-min-bytes",&local_8b)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"set minimum size for --externalize-inline-images",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--ii-min-bytes=size-in-bytes\n\nDon\'t externalize inline images smaller than this size. The\ndefault is 1,024. Use 0 for no minimum.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--min-version",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"set minimum PDF version",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--min-version=version\n\nForce the PDF version of the output to be at least the specified\nversion. The version number format is\n\"major.minor[.extension-level]\", which sets the version header\nto \"major.minor\" and the extension level, if specified, to\n\"extension-level\".\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--force-version",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"set output PDF version",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--force-version=version\n\nForce the output PDF file\'s PDF version header to be the specified\nvalue, even if the file uses features that may not be available\nin that version.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"page-ranges",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"page range syntax",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "A full description of the page range syntax, with examples, can be\nfound in the manual. In summary, a range is a comma-separated list\nof groups. A group is a number or a range of numbers separated by a\ndash. A group may be prepended by x to exclude its members from the\nprevious group. A number may be one of\n\n- <n>        where <n> represents a number is the <n>th page\n- r<n>       is the <n>th page from the end\n- z          the last page, same as r1\n\n- a,b,c      pages a, b, and c\n- a-b        pages a through b inclusive; if a > b, this counts down\n- a-b,xc     pages a through b except page c\n- a-b,xc-d   pages a through b except pages c through d\n\nYou can append :even or :odd to select every other page from the\nresulting set of pages, where :odd starts with the first page and\n:even starts with the second page. These are odd and even pages\nfrom the resulting set, not based on the original page numbers.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"modification",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"change parts of the PDF",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Modification options make systematic changes to certain parts of\nthe PDF, causing the PDF to render differently from the original.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--pages",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"begin page selection",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--pages [--file=]file [options] [...] --\n\nRun qpdf --help=page-selection for details.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--file",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"source for pages",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--file=file\n\nSpecify the file for the current page operation. This is used\nwith --pages, --overlay, and --underlay and appears between the\noption and the terminating --. Run qpdf --help=page-selection\nfor details.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--range",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"page range",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--range=numeric-range\n\nSpecify the page range for the current page operation with\n--pages. If omitted, all pages are selected. This is used\nwith --pages and appears between --pages and --. Run\nqpdf --help=page-selection for details.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--collate",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"collate with --pages",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--collate[=n[,m,...]]\n\nCollate rather than concatenate pages specified with --pages.\nWith a numeric parameter, collate in groups of n. The default\nis 1. With comma-separated numeric parameters, take n from the\nfirst file, m from the second, etc. Run\nqpdf --help=page-selection for additional details.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--split-pages",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"write pages to separate files",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--split-pages[=n]\n\nThis option causes qpdf to create separate output files for each\npage or group of pages rather than a single output file.\n\nFile names are generated from the specified output file as follows:\n\n- If the string %d appears in the output file name, it is replaced with a\n  zero-padded page range starting from 1\n- Otherwise, if the output file name ends in .pdf (case insensitive), a\n  zero-padded page range, preceded by a dash, is inserted before the file\n  extension\n- Otherwise, the file name is appended with a zero-padded page range\n  preceded by a dash.\n\nPage ranges are single page numbers for single-page groups or first-last\nfor multi-page groups.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--overlay",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"begin overlay options",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--overlay file [options] --\n\nOverlay pages from another PDF file on the output.\nRun qpdf --help=overlay-underlay for details.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--underlay",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"begin underlay options",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--underlay file [options] --\n\nUnderlay pages from another PDF file on the output.\nRun qpdf --help=overlay-underlay for details.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--flatten-rotation",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"remove rotation from page dictionary",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "For each page that is rotated using the /Rotate key in the\npage\'s dictionary, remove the /Rotate key and implement the\nidentical rotation semantics by modifying the page\'s contents.\nThis can be useful if a broken PDF viewer fails to properly\nconsider page rotation metadata.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--flatten-annotations",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"push annotations into content",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--flatten-annotations=parameter\n\nPush page annotations into the content streams. This may be\nnecessary in some case when printing or splitting files.\nParameters: \"all\", \"print\", \"screen\".\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--rotate",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"rotate pages",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--rotate=[+|-]angle[:page-range]\n\nRotate specified pages by multiples of 90 degrees specifying\neither absolute or relative angles. \"angle\" may be 0, 90, 180,\nor 270. You almost always want to use +angle or -angle rather\nthan just angle, as discussed in the manual. Run\nqpdf --help=page-ranges for help with page ranges.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--generate-appearances",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"generate appearances for form fields",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "PDF form fields consist of values and appearances, which may be\ninconsistent with each other if a form field value has been\nmodified without updating its appearance. This option tells qpdf\nto generate new appearance streams. There are some limitations,\nwhich are discussed in the manual.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--optimize-images",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"use efficient compression for images",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Attempt to use DCT (JPEG) compression for images that fall\nwithin certain constraints as long as doing so decreases the\nsize in bytes of the image. See also help for the following\noptions:\n  --oi-min-width\n  --oi-min-height\n  --oi-min-area\n  --keep-inline-images\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--oi-min-width",&local_8b)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"minimum width for --optimize-images",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--oi-min-width=width\n\nDon\'t optimize images whose width is below the specified value.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--oi-min-height",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"minimum height for --optimize-images",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--oi-min-height=height\n\nDon\'t optimize images whose height is below the specified value.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--oi-min-area",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"minimum area for --optimize-images",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--oi-min-area=area-in-pixels\n\nDon\'t optimize images whose area in pixels is below the specified value.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--keep-inline-images",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"exclude inline images from optimization",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Prevent inline images from being considered by --optimize-images.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--remove-info",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"remove file information",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Exclude file information (except modification date) from the output file.\n",&local_8a
            );
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--remove-metadata",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"remove metadata",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Exclude metadata from the output file.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--remove-page-labels",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"remove explicit page numbers",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Exclude page labels (explicit page numbers) from the output file.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--remove-structure",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"remove metadata",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Exclude the structure tree from the output file.\n",&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--set-page-labels",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"modification",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"number pages for the entire document",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--set-page-labels label-spec ... --\n\nSet page labels (explicit page numbers) for the entire file.\nEach label-spec has the form\n\nfirst-page:[type][/start[/prefix]]\n\nwhere\n\n- \"first-page\" represents a sequential page number using the\n  same format as page ranges: a number, a number preceded by \"r\"\n  to indicate counting from the end, or \"z\" indicating the last\n  page\n- \"type\" is one of\n  - D: Arabic numerals (digits)\n  - A: Upper-case alphabetic characters\n  - a: Lower-case alphabetic characters\n  - R: Upper-case Roman numerals\n  - r: Lower-case Roman numerals\n  - omitted: the page number does not appear, though the prefix,\n    if specified will still appear\n- \"start\" must be a number >= 1\n- \"prefix\"` may be any string and is prepended to each page\n  label\n\nThe first label spec must have a first-page value of 1,\nindicating the first page of the document. If multiple page\nlabel specs are specified, they must be given in increasing\norder.\n\nIf multiple page label specs are specified, they must be given\nin increasing order.\n\nA given page label spec causes pages to be numbered according to\nthat scheme starting with first-page and continuing until the\nnext label spec or the end of the document. If you want to omit\nnumbering starting at a certain page, you can use first-page: as\nthe spec.\n\nExample: \"1:r 5:D\" would number the first four pages i through\niv, then the remaining pages with Arabic numerals starting with\n1 and continuing sequentially until the end of the document. For\nadditional examples, please consult the manual.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"encryption",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"create encrypted files",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Create encrypted files. Usage:\n\n--encrypt \\\n  [--user-password=user-password] \\\n  [--owner-password=owner-password] \\\n  --bits=key-length [options] --\n\nOR\n\n--encrypt user-password owner-password key-length [options] --\n\nThe first form, with flags for the passwords and bit length, was\nintroduced in qpdf 11.7.0. Only the --bits option is mandatory.\nThis form allows you to use any text as the password. If passwords\nare specified, they must be given before the --bits option.\n\nThe second form has been in qpdf since the beginning and will\ncontinue to be supported. Either or both of user-password and\nowner-password may be empty strings.\n\nThe key-length parameter must be either 40, 128, or 256. The user\nand/or owner password may be omitted. Omitting either password\nenables the PDF file to be opened without a password. Specifying\nthe same value for the user and owner password and specifying an\nempty owner password are both considered insecure.\n\nEncryption options are terminated by \"--\" by itself.\n\n40-bit encryption is insecure, as is 128-bit encryption without\nAES. Use 256-bit encryption unless you have a specific reason to\nuse an insecure format, such as testing or compatibility with very\nold viewers. You must use the --allow-weak-crypto flag to create\nencrypted files that use insecure cryptographic algorithms. The\n--allow-weak-crypto flag appears outside of --encrypt ... --\n(before --encrypt or after --).\n\nAvailable options vary by key length. Not all readers respect all\nrestrictions. Different PDF readers respond differently to various\ncombinations of options. Sometimes a PDF viewer may show you\nrestrictions that differ from what you selected. This is probably\nnot a bug in qpdf.\n\nOptions for 40-bit only:\n  --annotate=[y|n]         restrict comments, filling forms, and signing\n  --extract=[y|n]          restrict text/graphic extraction\n  --modify=[y|n]           restrict document modification\n  --print=[y|n]            restrict printing\n\nOptions for 128-bit or 256-bit:\n  --accessibility=[y|n]    restrict accessibility (..." /* TRUNCATED STRING LITERAL */
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--user-password",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"specify user password",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--user-password=user-password\n\nSet the user password of the encrypted file.\n",
             &local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--owner-password",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"specify owner password",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--owner-password=owner-password\n\nSet the owner password of the encrypted file.\n",
             &local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--bits",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"specify encryption key length",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--bits={48|128|256}\n\nSpecify the encryption key length. For best security, always use\na key length of 256.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--accessibility",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"restrict document accessibility",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--accessibility=[y|n]\n\nThis option is ignored except with very old encryption formats.\nThe current PDF specification does not allow restriction of\ndocument accessibility. This option is not available with 40-bit\nencryption.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--annotate",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"restrict document annotation",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--annotate=[y|n]\n\nEnable/disable modifying annotations including making comments\nand filling in form fields. For 128-bit and 256-bit encryption,\nthis also enables editing, creating, and deleting form fields\nunless --modify-other=n or --modify=none is also specified.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--assemble",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"restrict document assembly",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--assemble=[y|n]\n\nEnable/disable document assembly (rotation and reordering of\npages). This option is not available with 40-bit encryption.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--extract",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"restrict text/graphic extraction",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--extract=[y|n]\n\nEnable/disable text/graphic extraction for purposes other than\naccessibility.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--form",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"restrict form filling",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--form=[y|n]\n\nEnable/disable whether filling form fields is allowed even if\nmodification of annotations is disabled. This option is not\navailable with 40-bit encryption.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--modify-other",&local_8b)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"restrict other modifications",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--modify-other=[y|n]\n\nEnable/disable modifications not controlled by --assemble,\n--annotate, or --form. --modify-other=n is implied by any of the\nother --modify options. This option is not available with 40-bit\nencryption.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--modify",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"restrict document modification",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--modify=modify-opt\n\nFor 40-bit files, modify-opt may only be y or n and controls all\naspects of document modification.\n\nFor 128-bit and 256-bit encryption, modify-opt values allow\nenabling and disabling levels of restriction in a manner similar\nto how some PDF creation tools do it. modify-opt values map to\nother combinations of options as follows:\n\nall: allow full modification (the default)\nannotate: --modify-other=n\nform: --modify-other=n --annotate=n\nassembly: --modify-other=n --annotate=n --form=n\nnone: --modify-other=n --annotate=n --form=n --assemble=n\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--print",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"restrict printing",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--print=print-opt\n\nControl what kind of printing is allowed. For 40-bit encryption,\nprint-opt may only be y or n and enables or disables all\nprinting. For 128-bit and 256-bit encryption, print-opt may have\nthe following values:\n\nnone: disallow printing\nlow: allow low-resolution printing only\nfull: allow full printing (the default)\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--cleartext-metadata",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"don\'t encrypt metadata",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "If specified, don\'t encrypt document metadata even when\nencrypting the rest of the document. This option is not\navailable with 40-bit encryption.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--use-aes",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"use AES with 128-bit encryption",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--use-aes=[y|n]\n\nEnables/disables use of the more secure AES encryption with\n128-bit encryption. Specifying --use-aes=y forces the PDF\nversion to be at least 1.6. This option is only available with\n128-bit encryption. The default is \"n\" for compatibility\nreasons. Use 256-bit encryption instead.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--allow-insecure",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"allow empty owner passwords",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Allow creation of PDF files with empty owner passwords and\nnon-empty user passwords when using 256-bit encryption.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--force-V4",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"force V=4 in encryption dictionary",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "This option is for testing and is never needed in practice since\nqpdf does this automatically when needed.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--force-R5",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"use unsupported R=5 encryption",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Use an undocumented, unsupported, deprecated encryption\nalgorithm that existed only in Acrobat version IX. This option\nshould not be used except for compatibility testing.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"page-selection",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"select pages from one or more files",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Use the --pages option to select pages from multiple files. Usage:\n\nqpdf in.pdf --pages --file=input-file \\\n    [--range=page-range] [--password=password] [...] -- out.pdf\n\nOR\n\nqpdf in.pdf --pages input-file [--password=password] [page-range] \\\n    [...] -- out.pdf\n\nBetween --pages and the -- that terminates pages option, repeat\nthe following:\n\n--file=filename [--range=page-range] [--password=password] [options]\n\nFor compatibility, the file and range can be specified\npositionally. qpdf versions prior to 11.9.0\nrequire --password=password to immediately follow the filename. In\nthe older syntax, repeat the following:\n\nfilename [--password=password] [page-range]\n\nDocument-level information, such as outlines, tags, etc., is taken\nfrom in.pdf and is preserved in out.pdf. You can use --empty in place\nof an input file to start from an empty file and just copy pages\nequally from all files. You can use \".\" as a shorthand for the\nprimary input file (if not --empty). In the above example, \".\"\nwould refer to in.pdf.\n\nUse --password=password to specify the password for a\npassword-protected input file. If the same input file is used more\nthan once, you only need to supply the password the first time. If\nthe page range is omitted, all pages are selected.\n\nRun qpdf --help=page-ranges for help with page ranges.\n\nUse --collate=n to cause pages to be collated in groups of n pages\n(default 1) instead of concatenating the input.\nUse --collate=i,j,k,... to take i from the first, then j from the\nsecond, then k from the third, then i from the first, etc.\n\nExamples:\n\n- Start with in.pdf and append all pages from a.pdf and the even\n  pages from b.pdf, and write the output to out.pdf. Document-level\n  information from in.pdf is retained. Note the use of \".\" to refer\n  to in.pdf.\n\n  qpdf in.pdf --pages . a.pdf b.pdf 1-z:even -- out.pdf\n\n- Take all the pages from a.pdf, all the pages from b.pdf in\n  reverse, and only pages 3 and 6 from c.pdf and write the result\n  to out.pdf. Use password \"x\" to open b.pdf:\n\n  qpdf --empty --pages a.pdf b.pd..." /* TRUNCATED STRING LITERAL */
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"overlay-underlay",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"overlay/underlay pages from other PDF files",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "These options allow pages from another PDF file to be overlaid or\nunderlaid on the primary output. Overlaid pages are drawn on top of\nthe destination page and may obscure the page. Underlaid pages are\ndrawn below the destination page. Usage:\n\n{--overlay|--underlay} [--file=]file\n      [--password=password]\n      [--to=page-range]\n      [--from=[page-range]]\n      [--repeat=page-range]\n      --\n\nNote the use of \"--\" by itself to terminate overlay/underlay options.\n\nFor overlay and underlay, a file and optional password are specified, along\nwith a series of optional page ranges. The default behavior is that each\npage of the overlay or underlay file is imposed on the corresponding page\nof the primary output until it runs out of pages, and any extra pages are\nignored. You can also give a page range with --repeat to cause\nthose pages to be repeated after the original pages are exhausted.\n\nThis options are repeatable. Pages will be stacked in order of\nappearance: first underlays, then the original page, then overlays.\n\nRun qpdf --help=page-ranges for help with page ranges.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--to",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"overlay-underlay",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"destination pages for underlay/overlay",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--to=page-range\n\nSpecify the range of pages in the primary output to apply\noverlay/underlay to. See qpdf --help=page-ranges for help with\nthe page range syntax.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--from",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"overlay-underlay",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"source pages for underlay/overlay",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--from=[page-range]\n\nSpecify pages from the overlay/underlay file that are applied to\nthe destination pages. See qpdf --help=page-ranges for help\nwith the page range syntax. The page range may be omitted\nif --repeat is used.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--repeat",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"overlay-underlay",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"overlay/underlay pages to repeat",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--repeat=page-range\n\nSpecify pages from the overlay/underlay that are repeated after\n\"from\" pages have been exhausted. See qpdf --help=page-ranges\nfor help with the page range syntax.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"attachments",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"work with embedded files",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "It is possible to list, add, or delete embedded files (also known\nas attachments) and to copy attachments from other files. See help\non individual options for details. Run qpdf --help=add-attachment\nfor additional details about adding attachments. See also\n--help=--list-attachments and --help=--show-attachment.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--add-attachment",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"attachments",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"start add attachment options",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--add-attachment file [options] --\n\nThe --add-attachment flag and its options may be repeated to add\nmultiple attachments. Run qpdf --help=add-attachment for details.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--copy-attachments-from",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"attachments",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"start copy attachment options",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--copy-attachments-from file [options] --\n\nThe --copy-attachments-from flag and its options may be repeated\nto copy attachments from multiple files. Run\nqpdf --help=copy-attachments for details.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--remove-attachment",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"attachments",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"remove an embedded file",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--remove-attachment=key\n\nRemove an embedded file using its key. Get the key with\n--list-attachments.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"pdf-dates",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"PDF date format",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "When a date is required, the date should conform to the PDF date\nformat specification, which is \"D:yyyymmddhhmmssz\" where \"z\" is\neither literally upper case \"Z\" for UTC or a timezone offset in\nthe form \"-hh\'mm\'\" or \"+hh\'mm\'\". Negative timezone offsets indicate\ntime before UTC. Positive offsets indicate how far after. For\nexample, US Eastern Standard Time (America/New_York) is \"-05\'00\'\",\nand Indian Standard Time (Asia/Calcutta) is \"+05\'30\'\".\n\nExamples:\n- D:20210207161528-05\'00\'   February 7, 2021 at 4:15:28 p.m.\n- D:20210207211528Z         February 7, 2021 at 21:15:28 UTC\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"add-attachment",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"attach (embed) files",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "The options listed below appear between --add-attachment and its\nterminating \"--\".\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--key",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"add-attachment",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"specify attachment key",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--key=key\n\nSpecify the key to use for the attachment in the embedded files\ntable. It defaults to the last element (basename) of the\nattached file\'s filename.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--filename",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"add-attachment",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"set attachment\'s displayed filename",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--filename=name\n\nSpecify the filename to be used for the attachment. This is what\nis usually displayed to the user and is the name most graphical\nPDF viewers will use when saving a file. It defaults to the last\nelement (basename) of the attached file\'s filename.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--creationdate",&local_8b)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"add-attachment",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"set attachment\'s creation date",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--creationdate=date\n\nSpecify the attachment\'s creation date in PDF format; defaults\nto the current time. Run qpdf --help=pdf-dates for information\nabout the date format.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--moddate",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"add-attachment",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"set attachment\'s modification date",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--moddate=date\n\nSpecify the attachment\'s modification date in PDF format;\ndefaults to the current time. Run qpdf --help=pdf-dates for\ninformation about the date format.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--mimetype",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"add-attachment",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"attachment mime type, e.g. application/pdf",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--mimetype=type/subtype\n\nSpecify the mime type for the attachment, such as text/plain,\napplication/pdf, image/png, etc.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--description",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"add-attachment",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"set attachment\'s description",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--description=\"text\"\n\nSupply descriptive text for the attachment, displayed by some\nPDF viewers.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--replace",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"add-attachment",&local_8c)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"replace attachment with same key",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Indicate that any existing attachment with the same key should\nbe replaced by the new attachment. Otherwise, qpdf gives an\nerror if an attachment with that key is already present.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"copy-attachments",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"copy attachments from another file",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "The options listed below appear between --copy-attachments-from and\nits terminating \"--\".\n\nTo copy attachments from a password-protected file, use\nthe --password option after the file name.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--prefix",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"copy-attachments",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"key prefix for copying attachments",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--prefix=prefix\n\nPrepend a prefix to each key; may be needed if there are\nduplicate attachment keys. This affects the key only, not the\nfile name.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"inspection",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"inspect PDF files",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "These options provide tools for inspecting PDF files. When any of\nthe options in this section are specified, no output file may be\ngiven.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--is-encrypted",&local_8b)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"silently test whether a file is encrypted",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Silently exit with a code indicating the file\'s encryption status:\n\n0: the file is encrypted\n1: not used\n2: the file is not encrypted\n\nThis can be used with password-protected files even if you don\'t\nknow the password.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--requires-password",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"silently test a file\'s password",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Silently exit with a code indicating the file\'s password status:\n\n0: a password, other than as supplied, is required\n1: not used\n2: the file is not encrypted\n3: the file is encrypted, and correct password (if any) has been supplied\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--check",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"partially check whether PDF is valid",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Check the structure of the PDF file as well as a number of other\naspects of the file, and write information about the file to\nstandard output. Note that qpdf does not perform any validation\nof the actual PDF page content or semantic correctness of the\nPDF file. It merely checks that the PDF file is syntactically\nvalid. See also qpdf --help=exit-status.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--show-encryption",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"information about encrypted files",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Show document encryption parameters. Also show the document\'s\nuser password if the owner password is given and the file was\nencrypted using older encryption formats that allow user\npassword recovery.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--show-encryption-key",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show key with --show-encryption",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "When used with --show-encryption or --check, causes the\nunderlying encryption key to be displayed.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--check-linearization",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"check linearization tables",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Check to see whether a file is linearized and, if so, whether\nthe linearization hint tables are correct.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--show-linearization",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show linearization hint tables",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Check and display all data in the linearization hint tables.\n",
             &local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--show-xref",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show cross reference data",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Show the contents of the cross-reference table or stream (object\nlocations in the file) in a human-readable form. This is\nespecially useful for files with cross-reference streams, which\nare stored in a binary format.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--show-object",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show contents of an object",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--show-object={trailer|obj[,gen]}\n\nShow the contents of the given object. This is especially useful\nfor inspecting objects that are inside of object streams (also\nknown as \"compressed objects\").\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--raw-stream-data",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show raw stream data",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "When used with --show-object, if the object is a stream, write\nthe raw (compressed) binary stream data to standard output\ninstead of the object\'s contents. See also\n--filtered-stream-data.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--filtered-stream-data",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show filtered stream data",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "When used with --show-object, if the object is a stream, write\nthe filtered (uncompressed, potentially binary) stream data to\nstandard output instead of the object\'s contents. See also\n--raw-stream-data.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--show-npages",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show number of pages",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Print the number of pages in the input file on a line by itself.\nUseful for scripts.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--show-pages",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"display page dictionary information",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Show the object and generation number for each page dictionary\nobject and for each content stream associated with the page.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--with-images",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"include image details with --show-pages",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "When used with --show-pages, also shows the object and\ngeneration numbers for the image objects on each page.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--list-attachments",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"list embedded files",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Show the key and stream number for each embedded file. Combine\nwith --verbose for more detailed information.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--show-attachment",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"inspection",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"export an embedded file",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--show-attachment=key\n\nWrite the contents of the specified attachment to standard\noutput as binary data. Get the key with --list-attachments.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"json",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"JSON output for PDF information",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Show information about the PDF file in JSON format. Please see the\nJSON chapter in the qpdf manual for details.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--json",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"json",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show file in JSON format",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--json[=version]\n\nGenerate a JSON representation of the file. This is described in\ndepth in the JSON section of the manual. \"version\" may be a\nspecific version or \"latest\" (the default). Run qpdf --json-help\nfor a description of the generated JSON object.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--json-help",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"json",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show format of JSON output",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--json-help[=version]\n\nDescribe the format of the JSON output by writing to standard\noutput a JSON object with the same keys and with values\ncontaining descriptive text.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--json-key",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"json",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"limit which keys are in JSON output",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--json-key=key\n\nThis option is repeatable. If given, only the specified\ntop-level keys will be included in the JSON output. Otherwise,\nall keys will be included. With --json-output, when not given,\nonly the \"qpdf\" key will appear in the output.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--json-object",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"json",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"limit which objects are in JSON",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--json-object={trailer|obj[,gen]}\n\nThis option is repeatable. If given, only specified objects will\nbe shown in the \"objects\" key of the JSON output. Otherwise, all\nobjects will be shown.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--json-stream-data",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"json",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"how to handle streams in json output",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--json-stream-data={none|inline|file}\n\nWhen used with --json, this option controls whether streams in\njson output should be omitted, written inline (base64-encoded)\nor written to a file. If \"file\" is chosen, the file will be the\nname of the output file appended with -nnn where nnn is the\nobject number. The prefix can be overridden with\n--json-stream-prefix. The default is \"none\", except\nwhen --json-output is specified, in which case the default is\n\"inline\".\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--json-stream-prefix",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"json",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"prefix for json stream data files",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--json-stream-prefix=file-prefix\n\nWhen used with --json-stream-data=file, --json-stream-data=file-prefix\nsets the prefix for stream data files, overriding the default,\nwhich is to use the output file name. Whatever is given here\nwill be appended with -nnn to create the name of the file that\nwill contain the data for the stream stream in object nnn.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--json-output",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"json",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"apply defaults for JSON serialization",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--json-output[=version]\n\nImplies --json=version. Changes default values for certain\noptions so that the JSON output written is the most faithful\nrepresentation of the original PDF and contains no additional\nJSON keys. See also --json-stream-data, --json-stream-prefix,\nand --decode-level.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--json-input",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"json",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"input file is qpdf JSON",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Treat the input file as a JSON file in qpdf JSON format. See the\n\"qpdf JSON Format\" section of the manual for information about\nhow to use this option.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--update-from-json",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"json",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"update a PDF from qpdf JSON",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--update-from-json=qpdf-json-file\n\nUpdate a PDF file from a JSON file. Please see the \"qpdf JSON\"\nchapter of the manual for information about how to use this\noption.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"testing",(allocator<char> *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"options for testing or debugging",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "The options below are useful when writing automated test code that\nincludes files created by qpdf or when testing qpdf itself.\n"
             ,&local_8c);
  QPDFArgParser::addHelpTopic(ap,&local_88,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--static-id",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"testing",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"use a fixed document ID",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Use a fixed value for the document ID. This is intended for\ntesting only. Never use it for production files. See also\nqpdf --help=--deterministic-id.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--static-aes-iv",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"testing",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"use a fixed AES vector",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "Use a static initialization vector for AES-CBC. This is intended\nfor testing only so that output files can be reproducible. Never\nuse it for production files. This option is not secure since it\nsignificantly weakens the encryption.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--linearize-pass1",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"testing",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"save pass 1 of linearization",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "--linearize-pass1=file\n\nWrite the first pass of linearization to the named file. The\nresulting file is not a valid PDF file. This option is useful only\nfor debugging qpdf.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--test-json-schema",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"testing",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"test generated json against schema",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "This is used by qpdf\'s test suite to check consistency between\nthe output of qpdf --json and the output of qpdf --json-help.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"--report-memory-usage",&local_8b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"testing",&local_8c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"best effort report of memory usage",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "This is used by qpdf\'s performance test suite to report the\nmaximum amount of memory used in supported environments.\n"
             ,&local_8a);
  QPDFArgParser::addOptionHelp(ap,&local_88,&local_68,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "For detailed help, visit the qpdf manual: https://qpdf.readthedocs.io\n",
             (allocator<char> *)&local_68);
  QPDFArgParser::addHelpFooter(ap,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

static void add_help(QPDFArgParser& ap)
{
    add_help_1(ap);
    add_help_2(ap);
    add_help_3(ap);
    add_help_4(ap);
    add_help_5(ap);
    add_help_6(ap);
    add_help_7(ap);
    add_help_8(ap);
ap.addHelpFooter("For detailed help, visit the qpdf manual: https://qpdf.readthedocs.io\n");
}